

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

void Ivy_DecSetVar(Ivy_Dec_t *pNode,int iNum,uint Var)

{
  uint uVar1;
  uint uVar2;
  
  if ((uint)iNum < 6) {
    switch(iNum) {
    case 0:
      uVar2 = (Var & 0xf) << 8;
      uVar1 = 0xfffff0ff;
      break;
    case 1:
      uVar2 = (Var & 0xf) << 0xc;
      uVar1 = 0xffff0fff;
      break;
    case 2:
      uVar2 = (Var & 0xf) << 0x10;
      uVar1 = 0xfff0ffff;
      break;
    case 3:
      uVar2 = (Var & 0xf) << 0x14;
      uVar1 = 0xff0fffff;
      break;
    case 4:
      uVar2 = (Var & 0xf) << 0x18;
      uVar1 = 0xf0ffffff;
      break;
    case 5:
      uVar2 = Var << 0x1c;
      uVar1 = 0xfffffff;
    }
    *pNode = (Ivy_Dec_t)((uint)*pNode & uVar1 | uVar2);
    return;
  }
  __assert_fail("iNum >= 0 && iNum <= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                ,0x76,"void Ivy_DecSetVar(Ivy_Dec_t *, int, unsigned int)");
}

Assistant:

static inline void       Ivy_DecSetVar( Ivy_Dec_t * pNode, int iNum, unsigned Var )
{
    assert( iNum >= 0 && iNum <= 5 );
    switch( iNum )
    {
        case 0: pNode->Fan0 = Var; break;
        case 1: pNode->Fan1 = Var; break;
        case 2: pNode->Fan2 = Var; break;
        case 3: pNode->Fan3 = Var; break;
        case 4: pNode->Fan4 = Var; break;
        case 5: pNode->Fan5 = Var; break;
    }
}